

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O2

void __thiscall
charls_jpegls_encoder::check_stride(charls_jpegls_encoder *this,size_t stride,size_t source_size)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = calculate_stride(this);
  if (sVar1 < stride || sVar1 - stride == 0) {
    if (this->interleave_mode_ == None) {
      lVar2 = (ulong)(this->frame_info_).height * (long)(this->frame_info_).component_count * stride
      ;
    }
    else {
      lVar2 = (this->frame_info_).height * stride;
    }
    if ((sVar1 - stride) + lVar2 <= source_size) {
      return;
    }
  }
  charls::impl::throw_jpegls_error(invalid_argument_stride);
}

Assistant:

void check_stride(const size_t stride, const size_t source_size) const
    {
        const size_t minimum_stride{calculate_stride()};
        if (UNLIKELY(stride < minimum_stride))
            throw_jpegls_error(jpegls_errc::invalid_argument_stride);

        // Simple check to verify user input, and prevent out-of-bound read access.
        // Stride parameter defines the number of bytes on a scan line.
        if (interleave_mode_ == charls::interleave_mode::none)
        {
            const size_t minimum_source_size{stride * frame_info_.component_count * frame_info_.height - (stride - minimum_stride)};
            if (UNLIKELY(source_size < minimum_source_size))
                throw_jpegls_error(jpegls_errc::invalid_argument_stride);
        }
        else
        {
            const size_t minimum_source_size{stride * frame_info_.height - (stride - minimum_stride)};
            if (UNLIKELY(source_size < minimum_source_size))
                throw_jpegls_error(jpegls_errc::invalid_argument_stride);
        }
    }